

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ulong *puVar3;
  __int_type_conflict _Var4;
  __pointer_type pSVar5;
  bool bVar6;
  uint uVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar8;
  Rep *pRVar9;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  string *psVar11;
  string *s;
  ulong uVar12;
  uint uVar13;
  undefined8 extraout_RDX;
  undefined8 uVar14;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  uint uVar15;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this;
  ushort *puVar16;
  ulong uVar17;
  ushort *puVar18;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  uint *puVar19;
  uint64_t uVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar21;
  SerialArena *unaff_R13;
  ushort *puVar22;
  undefined1 auVar23 [16];
  pair<const_char_*,_unsigned_int> pVar24;
  string_view wire_bytes;
  string_view wire_bytes_00;
  LogMessageFatal local_40 [16];
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) goto LAB_0015e556;
  uVar7 = data.field_0._0_4_;
  if ((uVar7 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0015e258;
  }
  uVar15 = *(ushort *)(table_00.data + 10) & 0x1c0;
  if (uVar15 != 0x100) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x8f1);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_40,0x21,"Unsupported repeated string rep: ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_40,(unsigned_short)uVar15);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  this = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
         ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00);
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar15 = *(ushort *)(table_00.data + 10) & 0x600;
  puVar3 = (ulong *)this[2].data;
  uVar20 = hasbits;
  puVar22 = (ushort *)ptr;
  if (puVar3 == (ulong *)0x0) {
LAB_0015e420:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this);
      puVar18 = puVar22;
      ptr = InlineGreedyStringParser(s,(char *)puVar22,ctx);
      ctx_00 = extraout_RDX_02;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0015e536;
      puVar18 = (ushort *)(s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)puVar18;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar15,(uint16_t)uVar20
                          );
      ctx_00 = extraout_RDX_03;
      if (!bVar6) goto LAB_0015e536;
      puVar18 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = ptr < puVar18;
      if (ptr < puVar18) {
        bVar1 = (byte)*(ushort *)ptr;
        unaff_R13 = (SerialArena *)(ulong)bVar1;
        puVar22 = (ushort *)((long)ptr + 1);
        if ((char)bVar1 < '\0') {
          bVar2 = *(byte *)puVar22;
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
          uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          unaff_R13 = (SerialArena *)(ulong)uVar13;
          if ((char)bVar2 < '\0') {
            pVar24 = ReadTagFallback(ptr,uVar13);
            puVar22 = (ushort *)pVar24.first;
            unaff_R13 = (SerialArena *)(ulong)pVar24.second;
          }
          else {
            puVar22 = (ushort *)((long)ptr + 2);
          }
        }
      }
    } while ((ptr < puVar18) && ((uint)unaff_R13 == uVar7));
  }
  else {
    puVar18 = (ushort *)ptr;
    auVar23 = __tls_get_addr(&PTR_001b9f20);
    uVar14 = auVar23._8_8_;
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(auVar23._0_8_ + 8))->data;
    if (data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) goto LAB_0015e420;
    unaff_R13 = *(SerialArena **)(auVar23._0_8_ + 0x10);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this->data;
    if (((ulong)data.field_0 & 1) == 0) {
      pcVar8 = (char *)(ulong)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this);
      pcVar8 = (char *)(ulong)(uint)pRVar9->allocated_size;
      uVar14 = extraout_RDX;
    }
    pVar24._8_8_ = uVar14;
    pVar24.first = pcVar8;
    aVar21 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    if ((int)pcVar8 != *(int *)(this + 1)) goto LAB_0015e420;
    do {
      bVar1 = (byte)*puVar22;
      puVar16 = (ushort *)(ulong)bVar1;
      uVar13 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar24 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback((char *)puVar22,(uint)bVar1);
        puVar22 = (ushort *)pVar24.first;
        uVar13 = pVar24.second;
        puVar18 = puVar16;
      }
      else {
        puVar22 = (ushort *)((long)puVar22 + 1);
      }
      ctx_00 = pVar24._8_8_;
      if (puVar22 == (ushort *)0x0) {
        ptr = (char *)0x0;
      }
      else {
        _Var4 = (unaff_R13->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var4 != 0) {
          uVar12 = _Var4 - 0x20;
          (unaff_R13->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar12;
          pSVar5 = (unaff_R13->string_block_)._M_b._M_p;
          uVar17 = (ulong)pSVar5->allocated_size_ - 0x10;
          if (uVar17 < uVar12) {
            psVar11 = absl::lts_20240722::log_internal::
                      MakeCheckOpString<unsigned_long,unsigned_long>
                                (uVar12,uVar17,"offset <= effective_size()");
          }
          else {
            psVar11 = (string *)0x0;
          }
          if (psVar11 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/string_block.h"
                       ,0xa2,*(undefined8 *)(psVar11 + 8),*(undefined8 *)psVar11);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
          }
          aVar21.data = (long)&pSVar5[-1].next_ + _Var4;
        }
        data.field_0 = aVar21;
        if (_Var4 == 0) {
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         SerialArena::AllocateFromStringBlockFallback(unaff_R13);
        }
        *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
        *(undefined8 *)((long)data.field_0 + 8) = 0;
        *(undefined1 *)((long)data.field_0 + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse
                  ((RepeatedPtrFieldBase *)this,(void *)data.field_0);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)puVar22,uVar13,
                         (string *)data.field_0);
        ctx_00 = extraout_RDX_00;
        puVar18 = puVar22;
      }
      if ((ushort *)ptr == (ushort *)0x0) {
LAB_0015e536:
        pcVar8 = Error(msg,(char *)puVar18,ctx_00,data,table,hasbits);
        return pcVar8;
      }
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this,*(int *)(this + 1) + -1);
      puVar18 = (ushort *)(pVVar10->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)puVar18;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)pVVar10->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar15,(uint16_t)uVar20
                          );
      ctx_00 = extraout_RDX_01;
      if (!bVar6) goto LAB_0015e536;
      puVar22 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = ptr < puVar22;
      if (puVar22 <= ptr) break;
      bVar1 = (byte)*(ushort *)ptr;
      pVar24.second._0_1_ = bVar1;
      pVar24.first = (char *)ctx;
      pVar24._9_7_ = 0;
      puVar22 = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar22;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        pVar24 = (pair<const_char_*,_unsigned_int>)(ZEXT416(uVar13) << 0x40);
        if ((char)bVar2 < '\0') {
          puVar18 = (ushort *)(ulong)uVar13;
          pVar24 = ReadTagFallback(ptr,uVar13);
          puVar22 = (ushort *)pVar24.first;
        }
        else {
          puVar22 = (ushort *)((long)ptr + 2);
        }
      }
    } while (pVar24.second == uVar7);
  }
  if ((bVar6) && (ptr < (ctx->super_EpsCopyInputStream).limit_end_)) {
    uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar12 = (ulong)(uVar7 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
LAB_0015e258:
    pcVar8 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar19 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar19 & 3) != 0) {
LAB_0015e556:
      AlignFail();
    }
    *puVar19 = *puVar19 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (PROTOBUF_PREDICT_TRUE(
              arena != nullptr &&
              arena->impl_.GetSerialArenaFast(&serial_arena) &&
              field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr ||
                                     !MpVerifyUtf8(field[field.size() - 1],
                                                   table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (PROTOBUF_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}